

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

aiLight * __thiscall
Assimp::BlenderImporter::ConvertLight
          (BlenderImporter *this,Scene *param_1,Object *obj,Lamp *lamp,ConversionData *param_4)

{
  float fVar1;
  float fVar2;
  aiLight *this_00;
  pointer paVar3;
  aiColor3D local_e4;
  aiColor3D local_d8;
  aiColor3D local_cc;
  aiColor3D local_c0;
  aiColor3D local_b4;
  aiColor3D local_a8;
  aiVector3t<float> local_9c;
  aiVector3t<float> local_90;
  aiVector2D local_84;
  aiVector2D local_7c;
  aiVector3t<float> local_74;
  aiVector3t<float> local_68;
  aiVector3t<float> local_5c;
  aiVector3t<float> local_50 [2];
  unique_ptr<aiLight,_std::default_delete<aiLight>_> local_38;
  unique_ptr<aiLight,_std::default_delete<aiLight>_> out;
  ConversionData *param_4_local;
  Lamp *lamp_local;
  Object *obj_local;
  Scene *param_1_local;
  BlenderImporter *this_local;
  
  out._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight>_>._M_t.
  super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight>_>.
  super__Head_base<0UL,_aiLight_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiLight,_std::default_delete<aiLight>,_true,_true>)
       (__uniq_ptr_data<aiLight,_std::default_delete<aiLight>,_true,_true>)param_4;
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  std::unique_ptr<aiLight,std::default_delete<aiLight>>::
  unique_ptr<std::default_delete<aiLight>,void>
            ((unique_ptr<aiLight,std::default_delete<aiLight>> *)&local_38,this_00);
  paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
  aiString::operator=(&paVar3->mName,(obj->id).name + 2);
  switch(lamp->type) {
  case Type_Local:
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mType = aiLightSource_POINT;
    break;
  case Type_Sun:
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mType = aiLightSource_DIRECTIONAL;
    aiVector3t<float>::aiVector3t(&local_68,0.0,0.0,-1.0);
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    (paVar3->mDirection).z = local_68.z;
    (paVar3->mDirection).x = local_68.x;
    (paVar3->mDirection).y = local_68.y;
    aiVector3t<float>::aiVector3t(&local_74,0.0,1.0,0.0);
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    (paVar3->mUp).x = local_74.x;
    (paVar3->mUp).y = local_74.y;
    (paVar3->mUp).z = local_74.z;
    break;
  case Type_Spot:
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mType = aiLightSource_SPOT;
    aiVector3t<float>::aiVector3t(local_50,0.0,0.0,-1.0);
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    (paVar3->mDirection).z = local_50[0].z;
    (paVar3->mDirection).x = local_50[0].x;
    (paVar3->mDirection).y = local_50[0].y;
    aiVector3t<float>::aiVector3t(&local_5c,0.0,1.0,0.0);
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    (paVar3->mUp).x = local_5c.x;
    (paVar3->mUp).y = local_5c.y;
    (paVar3->mUp).z = local_5c.z;
    fVar1 = lamp->spotsize;
    fVar2 = lamp->spotblend;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAngleInnerCone = fVar1 * (1.0 - fVar2);
    fVar1 = lamp->spotsize;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAngleOuterCone = fVar1;
    break;
  default:
    break;
  case Type_Area:
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mType = aiLightSource_AREA;
    if (lamp->area_shape == 0) {
      aiVector2t<float>::aiVector2t(&local_7c,lamp->area_size,lamp->area_size);
      paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
      paVar3->mSize = local_7c;
    }
    else {
      aiVector2t<float>::aiVector2t(&local_84,lamp->area_size,lamp->area_sizey);
      paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
      paVar3->mSize = local_84;
    }
    aiVector3t<float>::aiVector3t(&local_90,0.0,0.0,-1.0);
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    (paVar3->mDirection).z = local_90.z;
    (paVar3->mDirection).x = local_90.x;
    (paVar3->mDirection).y = local_90.y;
    aiVector3t<float>::aiVector3t(&local_9c,0.0,1.0,0.0);
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    (paVar3->mUp).x = local_9c.x;
    (paVar3->mUp).y = local_9c.y;
    (paVar3->mUp).z = local_9c.z;
  }
  aiColor3D::aiColor3D(&local_b4,lamp->r,lamp->g,lamp->b);
  aiColor3D::operator*(&local_a8,lamp->energy);
  paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
  aiColor3D::operator=(&paVar3->mColorAmbient,&local_a8);
  aiColor3D::aiColor3D(&local_cc,lamp->r,lamp->g,lamp->b);
  aiColor3D::operator*(&local_c0,lamp->energy);
  paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
  aiColor3D::operator=(&paVar3->mColorSpecular,&local_c0);
  aiColor3D::aiColor3D(&local_e4,lamp->r,lamp->g,lamp->b);
  aiColor3D::operator*(&local_d8,lamp->energy);
  paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
  aiColor3D::operator=(&paVar3->mColorDiffuse,&local_d8);
  if ((((lamp->constant_coefficient != 1.0) || (NAN(lamp->constant_coefficient))) ||
      (lamp->linear_coefficient != 0.0)) ||
     (((NAN(lamp->linear_coefficient) || (lamp->quadratic_coefficient != 0.0)) ||
      ((NAN(lamp->quadratic_coefficient) || (lamp->dist <= 0.0)))))) {
    fVar1 = lamp->constant_coefficient;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAttenuationConstant = fVar1;
    fVar1 = lamp->linear_coefficient;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAttenuationLinear = fVar1;
    fVar1 = lamp->quadratic_coefficient;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAttenuationQuadratic = fVar1;
  }
  else {
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAttenuationConstant = 1.0;
    fVar1 = lamp->dist;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAttenuationLinear = 2.0 / fVar1;
    fVar1 = lamp->dist;
    fVar2 = lamp->dist;
    paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::operator->(&local_38);
    paVar3->mAttenuationQuadratic = 1.0 / (fVar1 * fVar2);
  }
  paVar3 = std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::release(&local_38);
  std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::~unique_ptr(&local_38);
  return paVar3;
}

Assistant:

aiLight* BlenderImporter::ConvertLight(const Scene& /*in*/, const Object* obj, const Lamp* lamp, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiLight> out(new aiLight());
    out->mName = obj->id.name+2;

    switch (lamp->type)
    {
        case Lamp::Type_Local:
            out->mType = aiLightSource_POINT;
            break;
        case Lamp::Type_Spot:
            out->mType = aiLightSource_SPOT;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);

            out->mAngleInnerCone = lamp->spotsize * (1.0f - lamp->spotblend);
            out->mAngleOuterCone = lamp->spotsize;
            break;
        case Lamp::Type_Sun:
            out->mType = aiLightSource_DIRECTIONAL;

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        case Lamp::Type_Area:
            out->mType = aiLightSource_AREA;

            if (lamp->area_shape == 0) {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_size);
            }
            else {
                out->mSize = aiVector2D(lamp->area_size, lamp->area_sizey);
            }

            // blender orients directional lights as facing toward -z
            out->mDirection = aiVector3D(0.f, 0.f, -1.f);
            out->mUp = aiVector3D(0.f, 1.f, 0.f);
            break;

        default:
            break;
    }

    out->mColorAmbient = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorSpecular = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;
    out->mColorDiffuse = aiColor3D(lamp->r, lamp->g, lamp->b) * lamp->energy;

    // If default values are supplied, compute the coefficients from light's max distance
    // Read this: https://imdoingitwrong.wordpress.com/2011/01/31/light-attenuation/
    //
    if (lamp->constant_coefficient == 1.0f && lamp->linear_coefficient == 0.0f && lamp->quadratic_coefficient == 0.0f && lamp->dist > 0.0f)
    {
        out->mAttenuationConstant = 1.0f;
        out->mAttenuationLinear = 2.0f / lamp->dist;
        out->mAttenuationQuadratic = 1.0f / (lamp->dist * lamp->dist);
    }
    else
    {
        out->mAttenuationConstant = lamp->constant_coefficient;
        out->mAttenuationLinear = lamp->linear_coefficient;
        out->mAttenuationQuadratic = lamp->quadratic_coefficient;
    }

    return out.release();
}